

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void __thiscall AGSSockAPI::Thread::stop(Thread *this)

{
  Lock local_18;
  Lock lock;
  Thread *this_local;
  
  lock.mutex_ = (Mutex *)this;
  if (this->data != (Data *)0x0) {
    Mutex::Lock::Lock(&local_18,&this->data->mutex);
    if ((this->data->active & 1U) != 0) {
      pthread_cancel(this->data->thread);
      this->data->active = false;
    }
    Mutex::Lock::~Lock(&local_18);
    return;
  }
  __assert_fail("data != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FTPlus[P]AGSsock/src/API.cpp"
                ,0xf7,"void AGSSockAPI::Thread::stop()");
}

Assistant:

void Thread::stop()
{
	assert(data != nullptr);

	{
		Mutex::Lock lock(data->mutex);

		if (data->active)
		{
		#ifdef _WIN32
			TerminateThread(data->handle, 0);
		#else
			pthread_cancel(data->thread);
		#endif
			data->active = false;
		}
		// Why is this not in the conditional?
	#ifdef _WIN32
		CloseHandle(data->handle);
	#endif
	}
}